

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZInstPrinter.c
# Opt level: O2

void printPCRelOperand(MCInst *MI,int OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  _Bool _Var3;
  MCOperand *op;
  int64_t iVar4;
  
  op = MCInst_getOperand(MI,OpNum);
  _Var3 = MCOperand_isImm(op);
  if (_Var3) {
    iVar4 = MCOperand_getImm(op);
    printInt32(O,(int)iVar4);
    if (MI->csh->detail != CS_OPT_OFF) {
      pcVar2 = MI->flat_insn->detail;
      puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[0] * 0x20 + 0x15;
      puVar1[0] = '\x02';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      pcVar2 = MI->flat_insn->detail;
      *(long *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[0] * 0x20 + 0x1d) =
           (long)(int)iVar4;
      puVar1 = (MI->flat_insn->detail->field_6).x86.opcode;
      *puVar1 = *puVar1 + '\x01';
    }
  }
  return;
}

Assistant:

static void printPCRelOperand(MCInst *MI, int OpNum, SStream *O)
{
	MCOperand *MO = MCInst_getOperand(MI, OpNum);
	int32_t imm;

	if (MCOperand_isImm(MO)) {
		imm = (int32_t)MCOperand_getImm(MO);

		printInt32(O, imm);

		if (MI->csh->detail) {
			MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].type = SYSZ_OP_IMM;
			MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].imm = (int64_t)imm;
			MI->flat_insn->detail->sysz.op_count++;
		}
	}
}